

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_shared.h
# Opt level: O1

Element_conflict
Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
::_multiply(Element_conflict a,Element_conflict b)

{
  Element_conflict EVar1;
  uint uVar2;
  ulong uVar3;
  Characteristic CVar4;
  
  uVar3 = (ulong)a;
  if (b < a) {
    uVar3 = (ulong)b;
  }
  if ((int)uVar3 != 0) {
    if (a < b) {
      a = b;
    }
    EVar1 = 0;
    do {
      if ((uVar3 & 1) != 0) {
        CVar4 = 0;
        if (productOfAllCharacteristics_ - EVar1 <= a) {
          CVar4 = productOfAllCharacteristics_;
        }
        EVar1 = (EVar1 + a) - CVar4;
      }
      CVar4 = 0;
      if (productOfAllCharacteristics_ - a <= a) {
        CVar4 = productOfAllCharacteristics_;
      }
      uVar2 = (uint)uVar3;
      uVar3 = uVar3 >> 1;
      a = a * 2 - CVar4;
    } while (1 < uVar2);
    return EVar1;
  }
  return 0;
}

Assistant:

static Element _multiply(Element a, Element b) {
    Element res = 0;
    Element temp_b = 0;

    if (b < a) std::swap(a, b);

    while (a != 0) {
      if (a & 1) {
        /* Add b to res, modulo m, without overflow */
        if (b >= productOfAllCharacteristics_ - res) res -= productOfAllCharacteristics_;
        res += b;
      }
      a >>= 1;

      /* Double b, modulo m */
      temp_b = b;
      if (b >= productOfAllCharacteristics_ - b) temp_b -= productOfAllCharacteristics_;
      b += temp_b;
    }
    return res;
  }